

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_writer.c
# Opt level: O0

int nhdp_writer_init(oonf_rfc5444_protocol *p)

{
  int iVar1;
  oonf_rfc5444_protocol *p_local;
  
  _protocol = p;
  _nhdp_message = (rfc5444_writer_message *)rfc5444_writer_register_message(&p->writer,0,1);
  if (_nhdp_message == (rfc5444_writer_message *)0x0) {
    if (((&log_global_mask)[LOG_NHDP_W] & 4) != 0) {
      oonf_log(4,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_writer.c",0x71,0,0,
               "Could not register NHDP Hello message");
    }
    p_local._4_4_ = -1;
  }
  else {
    _nhdp_message->addMessageHeader = _cb_addMessageHeader;
    iVar1 = rfc5444_writer_register_msgcontentprovider
                      (&_protocol->writer,&_nhdp_msgcontent_provider,_nhdp_addrtlvs,4);
    if (iVar1 == 0) {
      p_local._4_4_ = 0;
    }
    else {
      if (((&log_global_mask)[LOG_NHDP_W] & 4) != 0) {
        oonf_log(4,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_writer.c",0x79,0,0,
                 "Count not register NHDP msg contentprovider");
      }
      rfc5444_writer_unregister_message(&_protocol->writer,_nhdp_message);
      p_local._4_4_ = -1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int
nhdp_writer_init(struct oonf_rfc5444_protocol *p) {
  _protocol = p;

  _nhdp_message = rfc5444_writer_register_message(&_protocol->writer, RFC6130_MSGTYPE_HELLO, true);
  if (_nhdp_message == NULL) {
    OONF_WARN(LOG_NHDP_W, "Could not register NHDP Hello message");
    return -1;
  }

  _nhdp_message->addMessageHeader = _cb_addMessageHeader;

  if (rfc5444_writer_register_msgcontentprovider(
        &_protocol->writer, &_nhdp_msgcontent_provider, _nhdp_addrtlvs, ARRAYSIZE(_nhdp_addrtlvs))) {
    OONF_WARN(LOG_NHDP_W, "Count not register NHDP msg contentprovider");
    rfc5444_writer_unregister_message(&_protocol->writer, _nhdp_message);
    return -1;
  }
  return 0;
}